

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void y_object_suite::y_object_string_unicode(void)

{
  long lVar1;
  undefined8 *puVar2;
  char *pcVar3;
  reader reader;
  char input [111];
  undefined4 local_1f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_reader<char> local_1d0;
  char local_88 [104];
  undefined4 uStack_20;
  undefined3 uStack_1c;
  
  puVar2 = &DAT_00137490;
  pcVar3 = local_88;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pcVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    pcVar3 = pcVar3 + 8;
  }
  uStack_1c = 0x7d20;
  uStack_20 = 0x22303334;
  local_1f0._M_dataplus._M_p = (pointer)strlen(local_88);
  local_1f0._M_string_length = (size_type)local_88;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_1d0,(view_type *)&local_1f0);
  local_1f4 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd34,"void y_object_suite::y_object_string_unicode()",&local_1f0,&local_1f4);
  trial::protocol::json::basic_reader<char>::next(&local_1d0);
  local_1f0._M_dataplus._M_p._0_4_ = local_1d0.decoder.current.code;
  local_1f4 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd36,"void y_object_suite::y_object_string_unicode()",&local_1f0,&local_1f4);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>(&local_1f0,&local_1d0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("reader.value<std::string>()","\"title\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd37,"void y_object_suite::y_object_string_unicode()",&local_1f0,"title");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  trial::protocol::json::basic_reader<char>::next(&local_1d0);
  local_1f0._M_dataplus._M_p._0_4_ = local_1d0.decoder.current.code;
  local_1f4 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd39,"void y_object_suite::y_object_string_unicode()",&local_1f0,&local_1f4);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>(&local_1f0,&local_1d0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[34]>
            ("reader.value<std::string>()",
             "\"\\u041f\\u043e\\u043b\\u0442\\u043e\\u0440\\u0430 \\u0417\\u0435\\u043c\\u043b\\u0435\\u043a\\u043e\\u043f\\u0430\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3a,"void y_object_suite::y_object_string_unicode()",&local_1f0,anon_var_dwarf_528c)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  trial::protocol::json::basic_reader<char>::next(&local_1d0);
  local_1f4 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3c,"void y_object_suite::y_object_string_unicode()",&local_1f0,&local_1f4);
  trial::protocol::json::basic_reader<char>::next(&local_1d0);
  local_1f0._M_dataplus._M_p._0_4_ = local_1d0.decoder.current.code;
  local_1f4 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3e,"void y_object_suite::y_object_string_unicode()",&local_1f0,&local_1f4);
  if (local_1d0.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_object_string_unicode()
{
    const char input[] = "{\"title\":\"\\u041f\\u043e\\u043b\\u0442\\u043e\\u0440\\u0430 \\u0417\\u0435\\u043c\\u043b\\u0435\\u043a\\u043e\\u043f\\u0430\" }";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "title");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\u041f\u043e\u043b\u0442\u043e\u0440\u0430 \u0417\u0435\u043c\u043b\u0435\u043a\u043e\u043f\u0430");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}